

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

int run_test_timer_start_twice(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  undefined8 uVar2;
  long lVar3;
  undefined4 **ppuVar4;
  uv_timer_t *puVar5;
  undefined4 *unaff_RBX;
  uv_timer_t once;
  undefined1 auStack_368 [152];
  code *pcStack_2d0;
  code *pcStack_2c8;
  code *pcStack_2c0;
  code *pcStack_2b8;
  code *pcStack_2b0;
  code *pcStack_2a8;
  code *pcStack_2a0;
  undefined4 uStack_298;
  undefined4 uStack_294;
  undefined4 *apuStack_290 [19];
  undefined4 *apuStack_1f8 [19];
  undefined4 *puStack_160;
  undefined1 auStack_148 [152];
  code *pcStack_b0;
  undefined1 local_a0 [152];
  
  pcStack_b0 = (code *)0x17710c;
  uVar2 = uv_default_loop();
  pcStack_b0 = (code *)0x177119;
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 == 0) {
    pcStack_b0 = (code *)0x177139;
    iVar1 = uv_timer_start(local_a0,never_cb,86400000,0);
    if (iVar1 != 0) goto LAB_001771b9;
    pcStack_b0 = (code *)0x177155;
    iVar1 = uv_timer_start(local_a0,once_cb,10,0);
    if (iVar1 != 0) goto LAB_001771be;
    pcStack_b0 = (code *)0x17715e;
    uVar2 = uv_default_loop();
    pcStack_b0 = (code *)0x177168;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001771c3;
    if (once_cb_called != 1) goto LAB_001771c8;
    pcStack_b0 = (code *)0x17717a;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_b0 = (code *)0x17718e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_b0 = (code *)0x177198;
    uv_run(unaff_RBX,0);
    pcStack_b0 = (code *)0x17719d;
    uVar2 = uv_default_loop();
    pcStack_b0 = (code *)0x1771a5;
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_b0 = (code *)0x1771b9;
    run_test_timer_start_twice_cold_1();
LAB_001771b9:
    pcStack_b0 = (code *)0x1771be;
    run_test_timer_start_twice_cold_2();
LAB_001771be:
    pcStack_b0 = (code *)0x1771c3;
    run_test_timer_start_twice_cold_3();
LAB_001771c3:
    pcStack_b0 = (code *)0x1771c8;
    run_test_timer_start_twice_cold_4();
LAB_001771c8:
    pcStack_b0 = (code *)0x1771cd;
    run_test_timer_start_twice_cold_5();
  }
  pcStack_b0 = run_test_timer_init;
  run_test_timer_start_twice_cold_6();
  pcStack_b0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_148);
  if (iVar1 == 0) {
    lVar3 = uv_timer_get_repeat(auStack_148);
    if (lVar3 != 0) goto LAB_00177251;
    iVar1 = uv_is_active(auStack_148);
    if (iVar1 != 0) goto LAB_00177256;
    unaff_RBX = (undefined4 *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    uv_run(unaff_RBX,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_00177251:
    run_test_timer_init_cold_2();
LAB_00177256:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  uStack_294 = 0;
  uStack_298 = 1;
  pcStack_2a0 = (code *)0x17727e;
  puStack_160 = unaff_RBX;
  ppuVar4 = (undefined4 **)uv_default_loop();
  pcStack_2a0 = (code *)0x17728e;
  iVar1 = uv_timer_init(ppuVar4,apuStack_1f8);
  if (iVar1 == 0) {
    pcStack_2a0 = (code *)0x17729b;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x1772a8;
    iVar1 = uv_timer_init(ppuVar4,apuStack_290);
    if (iVar1 != 0) goto LAB_001773f5;
    unaff_RBX = &uStack_294;
    ppuVar4 = apuStack_1f8;
    pcStack_2a0 = (code *)0x1772d0;
    apuStack_1f8[0] = unaff_RBX;
    iVar1 = uv_timer_start(ppuVar4,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_001773fa;
    ppuVar4 = apuStack_290;
    pcStack_2a0 = (code *)0x1772f3;
    apuStack_290[0] = &uStack_298;
    iVar1 = uv_timer_start(ppuVar4,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_001773ff;
    pcStack_2a0 = (code *)0x177300;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x17730a;
    iVar1 = uv_run(ppuVar4,0);
    if (iVar1 != 0) goto LAB_00177404;
    if (order_cb_called != 2) goto LAB_00177409;
    ppuVar4 = apuStack_1f8;
    pcStack_2a0 = (code *)0x17732c;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_0017740e;
    ppuVar4 = apuStack_290;
    pcStack_2a0 = (code *)0x17733e;
    iVar1 = uv_timer_stop();
    if (iVar1 != 0) goto LAB_00177413;
    order_cb_called = 0;
    ppuVar4 = apuStack_290;
    pcStack_2a0 = (code *)0x177368;
    apuStack_290[0] = unaff_RBX;
    iVar1 = uv_timer_start(ppuVar4,order_cb_b,0,0);
    if (iVar1 != 0) goto LAB_00177418;
    ppuVar4 = apuStack_1f8;
    pcStack_2a0 = (code *)0x17738b;
    apuStack_1f8[0] = &uStack_298;
    iVar1 = uv_timer_start(ppuVar4,order_cb_a,0,0);
    if (iVar1 != 0) goto LAB_0017741d;
    pcStack_2a0 = (code *)0x177398;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x1773a2;
    iVar1 = uv_run(ppuVar4,0);
    if (iVar1 != 0) goto LAB_00177422;
    if (order_cb_called != 2) goto LAB_00177427;
    pcStack_2a0 = (code *)0x1773b4;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_2a0 = (code *)0x1773c8;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2a0 = (code *)0x1773d2;
    uv_run(unaff_RBX,0);
    pcStack_2a0 = (code *)0x1773d7;
    ppuVar4 = (undefined4 **)uv_default_loop();
    pcStack_2a0 = (code *)0x1773df;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_2a0 = (code *)0x1773f5;
    run_test_timer_order_cold_1();
LAB_001773f5:
    pcStack_2a0 = (code *)0x1773fa;
    run_test_timer_order_cold_2();
LAB_001773fa:
    pcStack_2a0 = (code *)0x1773ff;
    run_test_timer_order_cold_3();
LAB_001773ff:
    pcStack_2a0 = (code *)0x177404;
    run_test_timer_order_cold_4();
LAB_00177404:
    pcStack_2a0 = (code *)0x177409;
    run_test_timer_order_cold_5();
LAB_00177409:
    pcStack_2a0 = (code *)0x17740e;
    run_test_timer_order_cold_6();
LAB_0017740e:
    pcStack_2a0 = (code *)0x177413;
    run_test_timer_order_cold_7();
LAB_00177413:
    pcStack_2a0 = (code *)0x177418;
    run_test_timer_order_cold_8();
LAB_00177418:
    pcStack_2a0 = (code *)0x17741d;
    run_test_timer_order_cold_9();
LAB_0017741d:
    pcStack_2a0 = (code *)0x177422;
    run_test_timer_order_cold_10();
LAB_00177422:
    pcStack_2a0 = (code *)0x177427;
    run_test_timer_order_cold_11();
LAB_00177427:
    pcStack_2a0 = (code *)0x17742c;
    run_test_timer_order_cold_12();
  }
  pcStack_2a0 = order_cb_a;
  run_test_timer_order_cold_13();
  iVar1 = order_cb_called;
  pcStack_2a0 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == **ppuVar4) {
    return iVar1;
  }
  pcStack_2a8 = order_cb_b;
  order_cb_a_cold_1();
  iVar1 = order_cb_called;
  pcStack_2a8 = (code *)(ulong)(uint)order_cb_called;
  order_cb_called = order_cb_called + 1;
  if (iVar1 == **ppuVar4) {
    return iVar1;
  }
  pcStack_2b0 = run_test_timer_huge_timeout;
  order_cb_b_cold_1();
  pcStack_2b8 = (code *)0x177471;
  pcStack_2b0 = (code *)unaff_RBX;
  puVar5 = (uv_timer_t *)uv_default_loop();
  pcStack_2b8 = (code *)0x177480;
  iVar1 = uv_timer_init(puVar5,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_2b8 = (code *)0x17748d;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x17749c;
    iVar1 = uv_timer_init(puVar5,&huge_timer1);
    if (iVar1 != 0) goto LAB_00177575;
    pcStack_2b8 = (code *)0x1774a9;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x1774b8;
    iVar1 = uv_timer_init(puVar5,&huge_timer2);
    if (iVar1 != 0) goto LAB_0017757a;
    puVar5 = &tiny_timer;
    pcStack_2b8 = (code *)0x1774da;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0017757f;
    puVar5 = &huge_timer1;
    pcStack_2b8 = (code *)0x177501;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177584;
    puVar5 = &huge_timer2;
    pcStack_2b8 = (code *)0x177521;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    if (iVar1 != 0) goto LAB_00177589;
    pcStack_2b8 = (code *)0x17752a;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x177534;
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_0017758e;
    pcStack_2b8 = (code *)0x17753d;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_2b8 = (code *)0x177551;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2b8 = (code *)0x17755b;
    uv_run(unaff_RBX,0);
    pcStack_2b8 = (code *)0x177560;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2b8 = (code *)0x177568;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_2b8 = (code *)0x177575;
    run_test_timer_huge_timeout_cold_1();
LAB_00177575:
    pcStack_2b8 = (code *)0x17757a;
    run_test_timer_huge_timeout_cold_2();
LAB_0017757a:
    pcStack_2b8 = (code *)0x17757f;
    run_test_timer_huge_timeout_cold_3();
LAB_0017757f:
    pcStack_2b8 = (code *)0x177584;
    run_test_timer_huge_timeout_cold_4();
LAB_00177584:
    pcStack_2b8 = (code *)0x177589;
    run_test_timer_huge_timeout_cold_5();
LAB_00177589:
    pcStack_2b8 = (code *)0x17758e;
    run_test_timer_huge_timeout_cold_6();
LAB_0017758e:
    pcStack_2b8 = (code *)0x177593;
    run_test_timer_huge_timeout_cold_7();
  }
  pcStack_2b8 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_8();
  if (puVar5 == &tiny_timer) {
    pcStack_2c0 = (code *)0x1775b3;
    uv_close(&tiny_timer,0);
    pcStack_2c0 = (code *)0x1775c1;
    uv_close(&huge_timer1,0);
    iVar1 = uv_close(&huge_timer2,0);
    return iVar1;
  }
  pcStack_2c0 = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_2c8 = (code *)0x1775db;
  pcStack_2c0 = (code *)unaff_RBX;
  puVar5 = (uv_timer_t *)uv_default_loop();
  pcStack_2c8 = (code *)0x1775ea;
  iVar1 = uv_timer_init(puVar5,&tiny_timer);
  if (iVar1 == 0) {
    pcStack_2c8 = (code *)0x1775f7;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2c8 = (code *)0x177606;
    iVar1 = uv_timer_init(puVar5,&huge_timer1);
    if (iVar1 != 0) goto LAB_001776a2;
    puVar5 = &tiny_timer;
    pcStack_2c8 = (code *)0x17762b;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    if (iVar1 != 0) goto LAB_001776a7;
    puVar5 = &huge_timer1;
    pcStack_2c8 = (code *)0x17764e;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    if (iVar1 != 0) goto LAB_001776ac;
    pcStack_2c8 = (code *)0x177657;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2c8 = (code *)0x177661;
    iVar1 = uv_run(puVar5,0);
    if (iVar1 != 0) goto LAB_001776b1;
    pcStack_2c8 = (code *)0x17766a;
    unaff_RBX = (undefined4 *)uv_default_loop();
    pcStack_2c8 = (code *)0x17767e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_2c8 = (code *)0x177688;
    uv_run(unaff_RBX,0);
    pcStack_2c8 = (code *)0x17768d;
    puVar5 = (uv_timer_t *)uv_default_loop();
    pcStack_2c8 = (code *)0x177695;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    pcStack_2c8 = (code *)0x1776a2;
    run_test_timer_huge_repeat_cold_1();
LAB_001776a2:
    pcStack_2c8 = (code *)0x1776a7;
    run_test_timer_huge_repeat_cold_2();
LAB_001776a7:
    pcStack_2c8 = (code *)0x1776ac;
    run_test_timer_huge_repeat_cold_3();
LAB_001776ac:
    pcStack_2c8 = (code *)0x1776b1;
    run_test_timer_huge_repeat_cold_4();
LAB_001776b1:
    pcStack_2c8 = (code *)0x1776b6;
    run_test_timer_huge_repeat_cold_5();
  }
  pcStack_2c8 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  pcStack_2c8._0_4_ = extraout_EAX;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar5 == &tiny_timer) goto LAB_001776e3;
    pcStack_2d0 = (code *)0x1776d7;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX_00;
  }
  if (puVar5 == &huge_timer1) {
LAB_001776e3:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls == 10) {
      pcStack_2d0 = (code *)0x1776fe;
      uv_close(&tiny_timer,0);
      iVar1 = uv_close(&huge_timer1,0);
      return iVar1;
    }
    return (int)pcStack_2c8;
  }
  pcStack_2d0 = run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  pcStack_2d0 = (code *)unaff_RBX;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_368);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_368,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00177823;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177828;
    if (timer_run_once_timer_cb_called != 1) goto LAB_0017782d;
    iVar1 = uv_timer_start(auStack_368,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00177832;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177837;
    if (timer_run_once_timer_cb_called != 2) goto LAB_0017783c;
    uv_close(auStack_368,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00177846;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00177823:
    run_test_timer_run_once_cold_2();
LAB_00177828:
    run_test_timer_run_once_cold_3();
LAB_0017782d:
    run_test_timer_run_once_cold_4();
LAB_00177832:
    run_test_timer_run_once_cold_5();
LAB_00177837:
    run_test_timer_run_once_cold_6();
LAB_0017783c:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00177846:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(timer_start_twice) {
  uv_timer_t once;
  int r;

  r = uv_timer_init(uv_default_loop(), &once);
  ASSERT(r == 0);
  r = uv_timer_start(&once, never_cb, 86400 * 1000, 0);
  ASSERT(r == 0);
  r = uv_timer_start(&once, once_cb, 10, 0);
  ASSERT(r == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(once_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}